

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Sampler>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Resources *this;
  RefData<vk::Handle<(vk::HandleType)20>_> data;
  RefData<vk::Handle<(vk::HandleType)20>_> data_00;
  RefData<vk::Handle<(vk::HandleType)20>_> data_01;
  RefData<vk::Handle<(vk::HandleType)20>_> data_02;
  allocator<char> local_209;
  string local_208;
  Move<vk::Handle<(vk::HandleType)20>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)20>_> local_1c8;
  undefined1 local_1a8 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> obj3;
  RefData<vk::Handle<(vk::HandleType)20>_> local_168;
  undefined1 local_148 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> obj2;
  RefData<vk::Handle<(vk::HandleType)20>_> local_108;
  undefined1 local_e8 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> obj1;
  Move<vk::Handle<(vk::HandleType)20>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)20>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)20>_> obj0;
  undefined1 local_50 [4];
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  Environment env;
  Context *context_local;
  
  Environment::Environment((Environment *)local_50,context,1);
  this = (Resources *)
         ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator + 7)
  ;
  Sampler::Resources::Resources(this,(Environment *)local_50,&params);
  Sampler::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
             + 6),(Environment *)local_50,&params);
  Sampler::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
             + 5),(Environment *)local_50,&params);
  Sampler::Resources::Resources
            ((Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
             + 4),(Environment *)local_50,&params);
  Sampler::create(&local_b8,(Environment *)local_50,this,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move(&local_b8);
  Sampler::create((Move<vk::Handle<(vk::HandleType)20>_> *)
                  &obj2.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator,
                  (Environment *)local_50,
                  (Resources *)
                  ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                          m_allocator + 6),&params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_108,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_108.deleter.m_deviceIface;
  data_00.object.m_internal = local_108.object.m_internal;
  data_00.deleter.m_device = local_108.deleter.m_device;
  data_00.deleter.m_allocator = local_108.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_e8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator);
  Sampler::create((Move<vk::Handle<(vk::HandleType)20>_> *)
                  &obj3.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator,
                  (Environment *)local_50,
                  (Resources *)
                  ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                          m_allocator + 5),&params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_168,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_168.deleter.m_deviceIface;
  data_01.object.m_internal = local_168.object.m_internal;
  data_01.deleter.m_device = local_168.deleter.m_device;
  data_01.deleter.m_allocator = local_168.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_148,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator);
  Sampler::create(&local_1e8,(Environment *)local_50,
                  (Resources *)
                  ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                          m_allocator + 4),&params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data_02.deleter.m_deviceIface = local_1c8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1c8.object.m_internal;
  data_02.deleter.m_device = local_1c8.deleter.m_device;
  data_02.deleter.m_allocator = local_1c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_1a8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move(&local_1e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_1a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_148);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)20>_> *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Ok",&local_209);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}